

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::unsubtract_example(example *ec)

{
  uchar uVar1;
  size_t sVar2;
  ostream *poVar3;
  v_array<unsigned_char> *in_RDI;
  features *fs;
  features *this;
  
  sVar2 = v_array<unsigned_char>::size(in_RDI);
  if (sVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "internal error (bug): trying to unsubtract_example, but there are no namespaces!"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    uVar1 = v_array<unsigned_char>::last(in_RDI);
    if (uVar1 == '~') {
      this = (features *)&in_RDI[0x19a].end_array;
      sVar2 = features::size((features *)0x3c8364);
      in_RDI[0x345]._begin = in_RDI[0x345]._begin + -sVar2;
      *(float *)((long)&in_RDI[0x345].end_array + 4) =
           *(float *)((long)&in_RDI[0x345].end_array + 4) - this->sum_feat_sq;
      features::clear(this);
      v_array<unsigned_char>::decr(in_RDI);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "internal error (bug): trying to unsubtract_example, but either it wasn\'t added, or something was added after and not removed!"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void unsubtract_example(example* ec)
{
  if (ec->indices.size() == 0)
  {
    cerr << "internal error (bug): trying to unsubtract_example, but there are no namespaces!" << endl;
    return;
  }

  if (ec->indices.last() != wap_ldf_namespace)
  {
    cerr << "internal error (bug): trying to unsubtract_example, but either it wasn't added, or something was added "
            "after and not removed!"
         << endl;
    return;
  }

  features& fs = ec->feature_space[wap_ldf_namespace];
  ec->num_features -= fs.size();
  ec->total_sum_feat_sq -= fs.sum_feat_sq;
  fs.clear();
  ec->indices.decr();
}